

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O2

void vera::lineBoundingBox(vec4 *_bbox,Shader *_program)

{
  undefined4 uVar1;
  undefined4 uVar2;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  positions;
  undefined8 local_30;
  _Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30._0_4_ =
       *(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *)&_bbox->field_0;
  local_30._4_4_ =
       *(anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 *)&_bbox->field_1;
  std::
  vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<2,float,(glm::qualifier)0>>
            ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
              *)&local_28,(vec<2,_float,_(glm::qualifier)0> *)&local_30);
  uVar1 = _bbox->field_1;
  uVar2 = _bbox->field_2;
  local_30._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)uVar1;
  local_30._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)uVar2;
  std::
  vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<2,float,(glm::qualifier)0>>
            ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
              *)&local_28,(vec<2,_float,_(glm::qualifier)0> *)&local_30);
  local_30._0_4_ =
       *(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *)&_bbox->field_2;
  local_30._4_4_ =
       *(anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 *)&_bbox->field_3;
  std::
  vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<2,float,(glm::qualifier)0>>
            ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
              *)&local_28,(vec<2,_float,_(glm::qualifier)0> *)&local_30);
  local_30._4_4_ = _bbox->field_3;
  local_30._0_4_ = _bbox->field_0;
  std::
  vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<2,float,(glm::qualifier)0>>
            ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
              *)&local_28,(vec<2,_float,_(glm::qualifier)0> *)&local_30);
  local_30._0_4_ =
       *(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *)&_bbox->field_0;
  local_30._4_4_ =
       *(anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 *)&_bbox->field_1;
  std::
  vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<2,float,(glm::qualifier)0>>
            ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
              *)&local_28,(vec<2,_float,_(glm::qualifier)0> *)&local_30);
  line((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
        *)&local_28,_program);
  std::
  _Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&local_28);
  return;
}

Assistant:

void lineBoundingBox(const glm::vec4& _bbox, Shader* _program) {
    std::vector<glm::vec2> positions;
    positions.push_back( glm::vec2(_bbox.x, _bbox.y) );
    positions.push_back( glm::vec2(_bbox.z, _bbox.y) );
    positions.push_back( glm::vec2(_bbox.z, _bbox.w) );
    positions.push_back( glm::vec2(_bbox.x, _bbox.w) );
    positions.push_back( glm::vec2(_bbox.x, _bbox.y) );
    line(positions, _program);
}